

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dump.cc
# Opt level: O0

void re2::DumpRegexpAppending(Regexp *re,string *s)

{
  RuneRange RVar1;
  undefined4 uVar2;
  RegexpOp RVar3;
  ParseFlags PVar4;
  Rune RVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  Rune *pRVar10;
  ostream *poVar11;
  string *psVar12;
  Regexp **ppRVar13;
  CharClass *pCVar14;
  RuneRange RVar15;
  string local_268 [32];
  string local_248 [32];
  undefined8 local_228;
  RuneRange rr;
  iterator it;
  string sep;
  string local_1f8 [48];
  LogMessage local_1c8;
  int local_44;
  char local_3d;
  int i_2;
  Rune RStack_38;
  char buf_1 [5];
  Rune r_3;
  int i_1;
  Rune RStack_28;
  char buf [5];
  Rune r_2;
  Rune r_1;
  int i;
  Rune r;
  string *s_local;
  Regexp *re_local;
  
  RVar3 = Regexp::op(re);
  if (((int)RVar3 < 0) || (RVar3 = Regexp::op(re), 0x15 < (int)RVar3)) {
    RVar3 = Regexp::op(re);
    StringAppendF(s,"op%d",(ulong)RVar3);
  }
  else {
    RVar3 = Regexp::op(re);
    if (RVar3 - kRegexpStar < 4) {
      PVar4 = Regexp::parse_flags(re);
      PVar4 = operator&(PVar4,NonGreedy);
      if (PVar4 != NoParseFlags) {
        std::__cxx11::string::append((char *)s);
      }
    }
    Regexp::op(re);
    std::__cxx11::string::append((char *)s);
    RVar3 = Regexp::op(re);
    if (RVar3 == kRegexpLiteral) {
      PVar4 = Regexp::parse_flags(re);
      PVar4 = operator&(PVar4,FoldCase);
      if (((PVar4 != NoParseFlags) && (RVar5 = Regexp::rune(re), 0x60 < RVar5)) && (RVar5 < 0x7b)) {
        std::__cxx11::string::append((char *)s);
      }
    }
    RVar3 = Regexp::op(re);
    if (RVar3 == kRegexpLiteralString) {
      PVar4 = Regexp::parse_flags(re);
      PVar4 = operator&(PVar4,FoldCase);
      if (PVar4 != NoParseFlags) {
        for (r_2 = 0; iVar6 = Regexp::nrunes(re), r_2 < iVar6; r_2 = r_2 + 1) {
          pRVar10 = Regexp::runes(re);
          buf._1_4_ = pRVar10[r_2];
          if ((0x60 < (int)buf._1_4_) && ((int)buf._1_4_ < 0x7b)) {
            std::__cxx11::string::append((char *)s);
            break;
          }
        }
      }
    }
  }
  std::__cxx11::string::append((char *)s);
  RVar3 = Regexp::op(re);
  switch(RVar3) {
  case kRegexpLiteral:
    RStack_28 = Regexp::rune(re);
    iVar6 = runetochar((char *)((long)&r_3 + 3),&stack0xffffffffffffffd8);
    *(undefined1 *)((long)&r_3 + (long)iVar6 + 3) = 0;
    std::__cxx11::string::append((char *)s);
    break;
  case kRegexpLiteralString:
    buf_1[1] = '\0';
    buf_1[2] = '\0';
    buf_1[3] = '\0';
    buf_1[4] = '\0';
    for (; uVar2 = buf_1._1_4_, iVar6 = Regexp::nrunes(re), (int)uVar2 < iVar6;
        buf_1._1_4_ = buf_1._1_4_ + 1) {
      pRVar10 = Regexp::runes(re);
      RStack_38 = pRVar10[(int)buf_1._1_4_];
      iVar6 = runetochar(&local_3d,&stack0xffffffffffffffc8);
      (&local_3d)[iVar6] = '\0';
      std::__cxx11::string::append((char *)s);
    }
    break;
  case kRegexpConcat:
  case kRegexpAlternate:
    for (local_44 = 0; iVar6 = local_44, iVar7 = Regexp::nsub(re), iVar6 < iVar7;
        local_44 = local_44 + 1) {
      ppRVar13 = Regexp::sub(re);
      DumpRegexpAppending(ppRVar13[local_44],s);
    }
    break;
  case kRegexpStar:
  case kRegexpPlus:
  case kRegexpQuest:
    ppRVar13 = Regexp::sub(re);
    DumpRegexpAppending(*ppRVar13,s);
    break;
  case kRegexpRepeat:
    uVar8 = Regexp::min(re);
    uVar9 = Regexp::max(re);
    StringPrintf_abi_cxx11_((char *)local_1f8,"%d,%d ",(ulong)uVar8,(ulong)uVar9);
    std::__cxx11::string::append((string *)s);
    std::__cxx11::string::~string(local_1f8);
    ppRVar13 = Regexp::sub(re);
    DumpRegexpAppending(*ppRVar13,s);
    break;
  case kRegexpCapture:
    iVar6 = Regexp::cap(re);
    if (iVar6 == 0) {
      LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_1c8,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/dump.cc"
                 ,0x7c);
      poVar11 = LogMessage::stream(&local_1c8);
      std::operator<<(poVar11,"kRegexpCapture cap() == 0");
      LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1c8);
    }
    psVar12 = Regexp::name_abi_cxx11_(re);
    if (psVar12 != (string *)0x0) {
      Regexp::name_abi_cxx11_(re);
      std::__cxx11::string::append((string *)s);
      std::__cxx11::string::append((char *)s);
    }
    ppRVar13 = Regexp::sub(re);
    DumpRegexpAppending(*ppRVar13,s);
    break;
  default:
    break;
  case kRegexpEndText:
    PVar4 = Regexp::parse_flags(re);
    PVar4 = operator&(PVar4,WasDollar);
    if (PVar4 == NoParseFlags) {
      std::__cxx11::string::append((char *)s);
    }
    break;
  case kRegexpCharClass:
    std::__cxx11::string::string((string *)&it);
    pCVar14 = Regexp::cc(re);
    rr = (RuneRange)CharClass::begin(pCVar14);
    while( true ) {
      RVar1 = rr;
      pCVar14 = Regexp::cc(re);
      RVar15 = (RuneRange)CharClass::end(pCVar14);
      if (RVar1 == RVar15) break;
      local_228 = *(ulong *)rr;
      std::__cxx11::string::append((string *)s);
      if ((uint)local_228 == local_228._4_4_) {
        StringPrintf_abi_cxx11_((char *)local_248,"%#x",local_228 & 0xffffffff);
        std::__cxx11::string::append((string *)s);
        std::__cxx11::string::~string(local_248);
      }
      else {
        StringPrintf_abi_cxx11_
                  ((char *)local_268,"%#x-%#x",local_228 & 0xffffffff,(ulong)local_228._4_4_);
        std::__cxx11::string::append((string *)s);
        std::__cxx11::string::~string(local_268);
      }
      std::__cxx11::string::operator=((string *)&it," ");
      rr = (RuneRange)((long)rr + 8);
    }
    std::__cxx11::string::~string((string *)&it);
  }
  std::__cxx11::string::append((char *)s);
  return;
}

Assistant:

static void DumpRegexpAppending(Regexp* re, string* s) {
  if (re->op() < 0 || re->op() >= arraysize(kOpcodeNames)) {
    StringAppendF(s, "op%d", re->op());
  } else {
    switch (re->op()) {
      default:
        break;
      case kRegexpStar:
      case kRegexpPlus:
      case kRegexpQuest:
      case kRegexpRepeat:
        if (re->parse_flags() & Regexp::NonGreedy)
          s->append("n");
        break;
    }
    s->append(kOpcodeNames[re->op()]);
    if (re->op() == kRegexpLiteral && (re->parse_flags() & Regexp::FoldCase)) {
      Rune r = re->rune();
      if ('a' <= r && r <= 'z')
        s->append("fold");
    }
    if (re->op() == kRegexpLiteralString && (re->parse_flags() & Regexp::FoldCase)) {
      for (int i = 0; i < re->nrunes(); i++) {
        Rune r = re->runes()[i];
        if ('a' <= r && r <= 'z') {
          s->append("fold");
          break;
        }
      }
    }
  }
  s->append("{");
  switch (re->op()) {
    default:
      break;
    case kRegexpEndText:
      if (!(re->parse_flags() & Regexp::WasDollar)) {
        s->append("\\z");
      }
      break;
    case kRegexpLiteral: {
      Rune r = re->rune();
      char buf[UTFmax+1];
      buf[runetochar(buf, &r)] = 0;
      s->append(buf);
      break;
    }
    case kRegexpLiteralString:
      for (int i = 0; i < re->nrunes(); i++) {
        Rune r = re->runes()[i];
        char buf[UTFmax+1];
        buf[runetochar(buf, &r)] = 0;
        s->append(buf);
      }
      break;
    case kRegexpConcat:
    case kRegexpAlternate:
      for (int i = 0; i < re->nsub(); i++)
        DumpRegexpAppending(re->sub()[i], s);
      break;
    case kRegexpStar:
    case kRegexpPlus:
    case kRegexpQuest:
      DumpRegexpAppending(re->sub()[0], s);
      break;
    case kRegexpCapture:
      if (re->cap() == 0)
        LOG(DFATAL) << "kRegexpCapture cap() == 0";
      if (re->name()) {
        s->append(*re->name());
        s->append(":");
      }
      DumpRegexpAppending(re->sub()[0], s);
      break;
    case kRegexpRepeat:
      s->append(StringPrintf("%d,%d ", re->min(), re->max()));
      DumpRegexpAppending(re->sub()[0], s);
      break;
    case kRegexpCharClass: {
      string sep;
      for (CharClass::iterator it = re->cc()->begin();
           it != re->cc()->end(); ++it) {
        RuneRange rr = *it;
        s->append(sep);
        if (rr.lo == rr.hi)
          s->append(StringPrintf("%#x", rr.lo));
        else
          s->append(StringPrintf("%#x-%#x", rr.lo, rr.hi));
        sep = " ";
      }
      break;
    }
  }
  s->append("}");
}